

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivate::trySetValidIndex(QComboBoxPrivate *this)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  ItemFlags IVar4;
  int iVar5;
  long in_FS_OFFSET;
  QModelIndex local_70;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QComboBox::count(*(QComboBox **)&(this->super_QWidgetPrivate).field_0x8);
  iVar5 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != iVar5; iVar5 = iVar5 + 1) {
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = this->model;
    iVar1 = this->modelColumn;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,&this->root);
    (**(code **)(*(long *)pQVar2 + 0x60))((QModelIndex *)&local_58,pQVar2,iVar5,iVar1,&local_70);
    IVar4 = QModelIndex::flags((QModelIndex *)&local_58);
    if (((uint)IVar4.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
        & 0x20) != 0) goto LAB_003adecd;
  }
  local_58 = (undefined1 *)0xffffffffffffffff;
  puStack_50 = (undefined1 *)0x0;
  local_48.ptr = (QAbstractItemModel *)0x0;
LAB_003adecd:
  setCurrentIndex(this,(QModelIndex *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::trySetValidIndex()
{
    Q_Q(QComboBox);
    bool currentReset = false;

    const int rowCount = q->count();
    for (int pos = 0; pos < rowCount; ++pos) {
        const QModelIndex idx(model->index(pos, modelColumn, root));
        if (idx.flags() & Qt::ItemIsEnabled) {
            setCurrentIndex(idx);
            currentReset = true;
            break;
        }
    }

    if (!currentReset)
        setCurrentIndex(QModelIndex());
}